

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

int xmlAddEntity(xmlDocPtr doc,int extSubset,xmlChar *name,int type,xmlChar *ExternalID,
                xmlChar *SystemID,xmlChar *content,xmlEntityPtr *out)

{
  xmlDictPtr dict_00;
  uint uVar1;
  int iVar2;
  xmlDictStringsPtr_conflict pxVar3;
  xmlHashTablePtr pxVar4;
  xmlEntityPtr pxVar5;
  bool bVar6;
  xmlChar local_88;
  char cStack_87;
  undefined2 uStack_86;
  xmlChar local_84;
  char cStack_83;
  undefined2 uStack_82;
  xmlChar ref_1 [4];
  xmlChar ref [4];
  xmlChar *hex;
  int c;
  int valid;
  int res;
  xmlEntityPtr predef;
  xmlEntityPtr ret;
  xmlEntitiesTablePtr table;
  xmlDictPtr dict;
  xmlDtdPtr dtd;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  int extSubset_local;
  xmlDocPtr doc_local;
  
  if (out != (xmlEntityPtr *)0x0) {
    *out = (xmlEntityPtr)0x0;
  }
  if ((doc == (xmlDocPtr)0x0) || (name == (xmlChar *)0x0)) {
    doc_local._4_4_ = 0x73;
  }
  else {
    dict_00 = doc->dict;
    if (extSubset == 0) {
      dict = (xmlDictPtr)doc->intSubset;
    }
    else {
      dict = (xmlDictPtr)doc->extSubset;
    }
    if (dict == (xmlDictPtr)0x0) {
      doc_local._4_4_ = 0x20a;
    }
    else {
      if (type - 1U < 3) {
        pxVar5 = xmlGetPredefinedEntity(name);
        if (pxVar5 != (xmlEntityPtr)0x0) {
          bVar6 = false;
          if ((type == 1) && (content != (xmlChar *)0x0)) {
            uVar1 = (uint)*pxVar5->content;
            if (((*content == uVar1) && (content[1] == '\0')) &&
               (((uVar1 == 0x3e || (uVar1 == 0x27)) || (uVar1 == 0x22)))) {
              bVar6 = true;
            }
            else if ((*content == '&') && (content[1] == '#')) {
              if (content[2] == 'x') {
                _ref_1 = "0123456789ABCDEF";
                _local_84 = CONCAT22(0x3b,CONCAT11("0123456789ABCDEF"[(int)(uVar1 % 0x10)],
                                                   "0123456789ABCDEF"
                                                   [(int)(((ulong)(long)(int)uVar1 / 0x10) % 0x10)])
                                    );
                iVar2 = xmlStrcasecmp(content + 3,&local_84);
                bVar6 = iVar2 == 0;
              }
              else {
                _local_88 = CONCAT22(0x3b,CONCAT11(*pxVar5->content % 10 + 0x30,
                                                   (char)(((ulong)(long)(int)uVar1 / 10) % 10) + '0'
                                                  ));
                iVar2 = xmlStrEqual(content + 2,&local_88);
                bVar6 = iVar2 != 0;
              }
            }
          }
          if (!bVar6) {
            return 0x75;
          }
        }
        if (dict[1].strings == (xmlDictStringsPtr_conflict)0x0) {
          pxVar3 = (xmlDictStringsPtr_conflict)xmlHashCreateDict(0,dict_00);
          dict[1].strings = pxVar3;
          if (dict[1].strings == (xmlDictStringsPtr_conflict)0x0) {
            return 2;
          }
        }
        ret = (xmlEntityPtr)dict[1].strings;
      }
      else {
        if (1 < type - 4U) {
          return 0x73;
        }
        if (dict[1].limit == 0) {
          pxVar4 = xmlHashCreateDict(0,dict_00);
          dict[1].limit = (size_t)pxVar4;
          if (dict[1].limit == 0) {
            return 2;
          }
        }
        ret = (xmlEntityPtr)dict[1].limit;
      }
      pxVar5 = xmlCreateEntity(*(xmlDocPtr *)(dict + 1),name,type,ExternalID,SystemID,content);
      if (pxVar5 == (xmlEntityPtr)0x0) {
        doc_local._4_4_ = 2;
      }
      else {
        iVar2 = xmlHashAdd((xmlHashTablePtr)ret,name,pxVar5);
        if (iVar2 < 0) {
          xmlFreeEntity(pxVar5);
          doc_local._4_4_ = 2;
        }
        else if (iVar2 == 0) {
          xmlFreeEntity(pxVar5);
          doc_local._4_4_ = 0x6b;
        }
        else {
          pxVar5->parent = (_xmlDtd *)dict;
          pxVar5->doc = *(_xmlDoc **)(dict + 1);
          if (dict->strings == (xmlDictStringsPtr_conflict)0x0) {
            dict->strings = (xmlDictStringsPtr_conflict)pxVar5;
            *(xmlEntityPtr *)&dict->nbElems = pxVar5;
          }
          else {
            dict->strings[1].next = (xmlDictStringsPtr)pxVar5;
            pxVar5->prev = (_xmlNode *)dict->strings;
            dict->strings = (xmlDictStringsPtr_conflict)pxVar5;
          }
          if (out != (xmlEntityPtr *)0x0) {
            *out = pxVar5;
          }
          doc_local._4_4_ = 0;
        }
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlAddEntity(xmlDocPtr doc, int extSubset, const xmlChar *name, int type,
	  const xmlChar *ExternalID, const xmlChar *SystemID,
	  const xmlChar *content, xmlEntityPtr *out) {
    xmlDtdPtr dtd;
    xmlDictPtr dict = NULL;
    xmlEntitiesTablePtr table = NULL;
    xmlEntityPtr ret, predef;
    int res;

    if (out != NULL)
        *out = NULL;
    if ((doc == NULL) || (name == NULL))
	return(XML_ERR_ARGUMENT);
    dict = doc->dict;

    if (extSubset)
        dtd = doc->extSubset;
    else
        dtd = doc->intSubset;
    if (dtd == NULL)
        return(XML_DTD_NO_DTD);

    switch (type) {
        case XML_INTERNAL_GENERAL_ENTITY:
        case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
        case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
            predef = xmlGetPredefinedEntity(name);
            if (predef != NULL) {
                int valid = 0;

                /* 4.6 Predefined Entities */
                if ((type == XML_INTERNAL_GENERAL_ENTITY) &&
                    (content != NULL)) {
                    int c = predef->content[0];

                    if (((content[0] == c) && (content[1] == 0)) &&
                        ((c == '>') || (c == '\'') || (c == '"'))) {
                        valid = 1;
                    } else if ((content[0] == '&') && (content[1] == '#')) {
                        if (content[2] == 'x') {
                            xmlChar *hex = BAD_CAST "0123456789ABCDEF";
                            xmlChar ref[] = "00;";

                            ref[0] = hex[c / 16 % 16];
                            ref[1] = hex[c % 16];
                            if (xmlStrcasecmp(&content[3], ref) == 0)
                                valid = 1;
                        } else {
                            xmlChar ref[] = "00;";

                            ref[0] = '0' + c / 10 % 10;
                            ref[1] = '0' + c % 10;
                            if (xmlStrEqual(&content[2], ref))
                                valid = 1;
                        }
                    }
                }
                if (!valid)
                    return(XML_ERR_REDECL_PREDEF_ENTITY);
            }
	    if (dtd->entities == NULL) {
		dtd->entities = xmlHashCreateDict(0, dict);
                if (dtd->entities == NULL)
                    return(XML_ERR_NO_MEMORY);
            }
	    table = dtd->entities;
	    break;
        case XML_INTERNAL_PARAMETER_ENTITY:
        case XML_EXTERNAL_PARAMETER_ENTITY:
	    if (dtd->pentities == NULL) {
		dtd->pentities = xmlHashCreateDict(0, dict);
                if (dtd->pentities == NULL)
                    return(XML_ERR_NO_MEMORY);
            }
	    table = dtd->pentities;
	    break;
        default:
	    return(XML_ERR_ARGUMENT);
    }
    ret = xmlCreateEntity(dtd->doc, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(XML_ERR_NO_MEMORY);

    res = xmlHashAdd(table, name, ret);
    if (res < 0) {
        xmlFreeEntity(ret);
        return(XML_ERR_NO_MEMORY);
    } else if (res == 0) {
	/*
	 * entity was already defined at another level.
	 */
        xmlFreeEntity(ret);
	return(XML_WAR_ENTITY_REDEFINED);
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
	dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }

    if (out != NULL)
        *out = ret;
    return(0);
}